

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

void archive_read_extract_set_skip_file(archive *_a,int64_t d,int64_t i)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  archive_read *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x78) = 1;
    *(undefined8 *)(in_RDI + 0x80) = in_RSI;
    *(undefined8 *)(in_RDI + 0x88) = in_RDX;
  }
  return;
}

Assistant:

void
archive_read_extract_set_skip_file(struct archive *_a, int64_t d, int64_t i)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_extract_set_skip_file"))
		return;
	a->skip_file_set = 1;
	a->skip_file_dev = d;
	a->skip_file_ino = i;
}